

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_eol
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *__src;
  long lVar4;
  
  lVar4 = 0;
  __src = (byte *)0x0;
  do {
    pbVar3 = (byte *)s + 3;
    while (bVar1 = pbVar3[-3], ((anonymous_namespace)::chartype_table[bVar1] & 2) == 0) {
      bVar1 = pbVar3[-2];
      if (((anonymous_namespace)::chartype_table[bVar1] & 2) != 0) {
        pbVar3 = pbVar3 + -2;
        goto LAB_00693509;
      }
      bVar1 = pbVar3[-1];
      if (((anonymous_namespace)::chartype_table[bVar1] & 2) != 0) {
        pbVar3 = pbVar3 + -1;
        goto LAB_00693509;
      }
      bVar1 = *pbVar3;
      if (((anonymous_namespace)::chartype_table[bVar1] & 2) != 0) goto LAB_00693509;
      pbVar3 = pbVar3 + 4;
    }
    pbVar3 = pbVar3 + -3;
LAB_00693509:
    if (bVar1 == end_quote) {
      pbVar2 = pbVar3;
      if (__src != (byte *)0x0) {
        memmove(__src + -lVar4,__src,(long)pbVar3 - (long)__src);
        pbVar2 = pbVar3 + -lVar4;
      }
      *pbVar2 = 0;
      return (char_t *)(pbVar3 + 1);
    }
    if (bVar1 == 0xd) {
      s = (char_t *)(pbVar3 + 1);
      *pbVar3 = 10;
      if (pbVar3[1] == 10) {
        if (__src != (byte *)0x0) {
          memmove(__src + -lVar4,__src,(long)s - (long)__src);
        }
        s = (char_t *)(pbVar3 + 2);
        lVar4 = lVar4 + 1;
        __src = (byte *)s;
      }
    }
    else {
      if (bVar1 == 0) {
        return (char_t *)0x0;
      }
      s = (char_t *)(pbVar3 + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse_eol(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (*s == '\r')
				{
					*s++ = '\n';

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}